

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts.c
# Opt level: O2

int uts_numChildren_geo(Node *parent)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar4 = b_0;
  iVar1 = parent->height;
  dVar2 = b_0;
  if (0 < iVar1) {
    if (shape_fn == FIXED) {
      if (gen_mx <= iVar1) {
        dVar2 = 0.0;
      }
    }
    else if (shape_fn == CYCLIC) {
      dVar2 = 0.0;
      if (iVar1 == gen_mx * 5 || SBORROW4(iVar1,gen_mx * 5) != iVar1 + gen_mx * -5 < 0) {
        dVar2 = sin(((double)iVar1 * 6.283185307179586) / (double)gen_mx);
        dVar2 = pow(dVar4,dVar2);
      }
    }
    else if (shape_fn == EXPDEC) {
      dVar2 = log(b_0);
      dVar3 = log((double)gen_mx);
      dVar2 = pow((double)iVar1,-dVar2 / dVar3);
      dVar2 = dVar2 * dVar4;
    }
    else {
      dVar2 = b_0 * (1.0 - (double)iVar1 / (double)gen_mx);
    }
  }
  iVar1 = rng_rand((parent->state).state);
  dVar4 = rng_toProb(iVar1);
  dVar4 = log(1.0 - dVar4);
  dVar2 = log(1.0 - 1.0 / (dVar2 + 1.0));
  dVar4 = floor(dVar4 / dVar2);
  return (int)dVar4;
}

Assistant:

int uts_numChildren_geo(Node * parent) {
  double b_i = b_0;
  int depth = parent->height;
  int numChildren, h;
  double p, u;
  
  // use shape function to compute target b_i
  if (depth > 0){
    switch (shape_fn) {
      
      // expected size polynomial in depth
    case EXPDEC:
      b_i = b_0 * pow((double) depth, -log(b_0)/log((double) gen_mx));
      break;
      
      // cyclic tree size
    case CYCLIC:
      if (depth > 5 * gen_mx){
        b_i = 0.0;
        break;
      } 
      b_i = pow(b_0, 
                sin(2.0*3.141592653589793*(double) depth / (double) gen_mx));
      break;

      // identical distribution at all nodes up to max depth
    case FIXED:
      b_i = (depth < gen_mx)? b_0 : 0;
      break;
      
      // linear decrease in b_i
    case LINEAR:
    default:
      b_i =  b_0 * (1.0 - (double)depth / (double) gen_mx);
      break;
    }
  }

  // given target b_i, find prob p so expected value of 
  // geometric distribution is b_i.
  p = 1.0 / (1.0 + b_i);

  // get uniform random number on [0,1)
  h = rng_rand(parent->state.state);
  u = rng_toProb(h);

  // max number of children at this cumulative probability
  // (from inverse geometric cumulative density function)
  numChildren = (int) floor(log(1 - u) / log(1 - p)); 

  return numChildren;
}